

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

int run_test_poll_nested_epoll(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined1 local_a8 [4];
  int fd;
  uv_poll_t poll_handle;
  
  iVar1 = epoll_create(1);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x295,"fd != -1");
    abort();
  }
  puVar3 = uv_default_loop();
  iVar2 = uv_poll_init(puVar3,(uv_poll_t *)local_a8,iVar1);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x297,"0 == uv_poll_init(uv_default_loop(), &poll_handle, fd)");
    abort();
  }
  iVar2 = uv_poll_start((uv_poll_t *)local_a8,1,abort);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x298,"0 == uv_poll_start(&poll_handle, UV_READABLE, (uv_poll_cb) abort)");
    abort();
  }
  puVar3 = uv_default_loop();
  iVar2 = uv_run(puVar3,UV_RUN_NOWAIT);
  if (iVar2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x299,"0 != uv_run(uv_default_loop(), UV_RUN_NOWAIT)");
    abort();
  }
  uv_close((uv_handle_t *)local_a8,(uv_close_cb)0x0);
  puVar3 = uv_default_loop();
  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x29c,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x29d,"0 == close(fd)");
    abort();
  }
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x29f,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(poll_nested_epoll) {
  uv_poll_t poll_handle;
  int fd;

  fd = epoll_create(1);
  ASSERT(fd != -1);

  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, fd));
  ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, (uv_poll_cb) abort));
  ASSERT(0 != uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  uv_close((uv_handle_t*) &poll_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == close(fd));

  MAKE_VALGRIND_HAPPY();
  return 0;
}